

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O0

time_t my_timegm(my_tm *tm)

{
  int iVar1;
  int local_20;
  int leap_days;
  int year;
  int month;
  my_tm *tm_local;
  
  if (tm->tm_year < 0x46) {
    tm_local = (my_tm *)0xffffffffffffffff;
  }
  else {
    local_20 = tm->tm_year + 0x76c;
    leap_days = tm->tm_mon;
    if (leap_days < 0) {
      local_20 = (0xb - leap_days) / 0xc + local_20;
      leap_days = 0xb - (0xb - leap_days) % 0xc;
    }
    else if (0xb < leap_days) {
      local_20 = local_20 - leap_days / 0xc;
      leap_days = leap_days % 0xc;
    }
    iVar1 = local_20 - (uint)(tm->tm_mon < 2);
    tm_local = (my_tm *)(((((long)(local_20 + -0x7b2) * 0x16d +
                            (long)((iVar1 / 4 - iVar1 / 100) + iVar1 / 400 + -0x1dd) +
                            (long)my_timegm::month_days_cumulative[leap_days] + (long)tm->tm_mday +
                           -1) * 0x18 + (long)tm->tm_hour) * 0x3c + (long)tm->tm_min) * 0x3c +
                        (long)tm->tm_sec);
  }
  return (time_t)tm_local;
}

Assistant:

static time_t my_timegm(struct my_tm *tm)
{
  static const int month_days_cumulative [12] =
    { 0, 31, 59, 90, 120, 151, 181, 212, 243, 273, 304, 334 };
  int month, year, leap_days;

  if(tm->tm_year < 70)
    /* we don't support years before 1970 as they will cause this function
       to return a negative value */
    return -1;

  year = tm->tm_year + 1900;
  month = tm->tm_mon;
  if(month < 0) {
    year += (11 - month) / 12;
    month = 11 - (11 - month) % 12;
  }
  else if(month >= 12) {
    year -= month / 12;
    month = month % 12;
  }

  leap_days = year - (tm->tm_mon <= 1);
  leap_days = ((leap_days / 4) - (leap_days / 100) + (leap_days / 400)
               - (1969 / 4) + (1969 / 100) - (1969 / 400));

  return ((((time_t) (year - 1970) * 365
            + leap_days + month_days_cumulative [month] + tm->tm_mday - 1) * 24
           + tm->tm_hour) * 60 + tm->tm_min) * 60 + tm->tm_sec;
}